

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

double __thiscall chrono::ChDirectSolverLS::Solve(ChDirectSolverLS *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<double> *this_00;
  ChVectorDynamic<double> *other;
  uint uVar1;
  rep_conflict rVar2;
  ChLog *pCVar3;
  ChStreamOutAscii *pCVar4;
  ChDirectSolverLS *pCVar5;
  ChTimer<double> *this_01;
  RealScalar dVal;
  double dVar6;
  undefined1 local_80 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = &this->m_timer_solve_assembly;
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_start.__d.__r = rVar2;
  this_00 = &this->m_rhs;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,0,this_00);
  other = &this->m_sol;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&other->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows);
  ChTimer<double>::stop(this_01);
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    std::operator+(&local_50,"LS_",&(this->super_ChSolverLS).super_ChSolver.frame_id);
    pCVar5 = (ChDirectSolverLS *)local_80;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar5,
                   &local_50,"_b.dat");
    WriteVector(pCVar5,(string *)local_80,this_00);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)&local_50);
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_solvercall).m_start.__d.__r = rVar2;
  uVar1 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xd])(this);
  local_80._40_8_ = &this->m_timer_solve_solvercall;
  ChTimer<double>::stop(&this->m_timer_solve_solvercall);
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    local_80._32_8_ = this_01;
    std::operator+(&local_50,"LS_",&(this->super_ChSolverLS).super_ChSolver.frame_id);
    pCVar5 = (ChDirectSolverLS *)local_80;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar5,
                   &local_50,"_x.dat");
    WriteVector(pCVar5,(string *)local_80,other);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)&local_50);
    this_01 = (ChTimer<double> *)local_80._32_8_;
  }
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_start.__d.__r = rVar2;
  (*sysd->_vptr_ChSystemDescriptor[0x15])(sysd,other);
  ChTimer<double>::stop(this_01);
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    local_50._0_16_ =
         Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                   ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)
                    &(this->m_mat).super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_80,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
               (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_50);
    dVal = Eigen::
           MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>
           ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                   *)local_80);
    pCVar3 = GetLog();
    pCVar4 = ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii," Solver solve [");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,this->m_solve_call);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"]  |residual| = ");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVal);
    ChStreamOutAscii::operator<<(pCVar4,"\n\n");
    pCVar3 = GetLog();
    pCVar4 = ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"  assembly rhs+sol:  ");
    dVar6 = ChTimer<double>::GetTimeSecondsIntermediate(this_01);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVar6);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"s\n");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"  solve:             ");
    dVar6 = ChTimer<double>::GetTimeSecondsIntermediate((ChTimer<double> *)local_80._40_8_);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVar6);
    ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  if ((char)uVar1 == '\0') {
    pCVar3 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"Solver solve failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return (double)(uVar1 & 0xff);
}

Assistant:

double ChDirectSolverLS::Solve(ChSystemDescriptor& sysd) {
    // Assemble the problem right-hand side vector
    m_timer_solve_assembly.start();
    sysd.ConvertToMatrixForm(nullptr, &m_rhs);
    m_sol.resize(m_rhs.size());
    m_timer_solve_assembly.stop();

    if (write_matrix)
        WriteVector("LS_" + frame_id + "_b.dat", m_rhs);

    // Let the concrete solver compute the solution
    m_timer_solve_solvercall.start();
    bool result = SolveSystem();
    m_timer_solve_solvercall.stop();

    if (write_matrix)
        WriteVector("LS_" + frame_id + "_x.dat", m_sol);

    // Scatter solution vector to the system descriptor
    m_timer_solve_assembly.start();
    sysd.FromVectorToUnknowns(m_sol);
    m_timer_solve_assembly.stop();

    if (verbose) {
        double res_norm = (m_rhs - m_mat * m_sol).norm();
        GetLog() << " Solver solve [" << m_solve_call << "]  |residual| = " << res_norm << "\n\n";
        GetLog() << "  assembly rhs+sol:  " << m_timer_solve_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  solve:             " << m_timer_solve_solvercall.GetTimeSecondsIntermediate() << "\n";
    }

    if (!result) {
        // If the solution failed, let the concrete solver display an error message.
        GetLog() << "Solver solve failed\n";
        PrintErrorMessage();
    }

    return result;
}